

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

int strarray_append(strarray *array,char *string)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar3 = strlen(string);
  sVar1 = array->length;
  pcVar4 = (char *)realloc(array->value,sVar3 + sVar1 + 0x40 & 0xffffffffffffffc0);
  if (pcVar4 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    memcpy(pcVar4 + array->length,string,sVar3 + 1);
    array->value = pcVar4;
    array->length = sVar1 + sVar3 + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
strarray_append(struct strarray *array, const char *string) {
  size_t length, new_length;
  char *ptr;

  length = strlen(string) + 1;

  new_length = array->length + length;
  ptr = realloc(array->value, STRARRAY_MEMSIZE(new_length));
  if (ptr == NULL) {
    return -1;
  }

  memcpy(ptr + array->length, string, length);
  array->value = ptr;
  array->length = new_length;
  return 0;
}